

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZMatrix<std::complex<double>_>_*>::TPZVec
          (TPZVec<TPZMatrix<std::complex<double>_>_*> *this,int64_t size)

{
  TPZMatrix<std::complex<double>_> **ppTVar1;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0198f498;
  this->fStore = (TPZMatrix<std::complex<double>_> **)0x0;
  if (size < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZVec<TPZMatrix<std::complex<double>> *>::TPZVec(const int64_t) [T = TPZMatrix<std::complex<double>> *]"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n",0x23);
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      ppTVar1 = (TPZMatrix<std::complex<double>_> **)
                operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
      this->fStore = ppTVar1;
    }
    this->fNElements = size;
    this->fNAlloc = size;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	// If a positive value was requested, allocate it.
	if( size > 0 )
	{
		fStore = new T[ size ];
	}
	
	// Note that even 0 sized vectors are allowed.
	fNElements = size;
    fNAlloc = size;
    
}